

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O2

void __thiscall kj::_::anon_unknown_0::MockExceptionCallback::flush(MockExceptionCallback *this)

{
  ssize_t sVar1;
  int *piVar2;
  pointer pcVar3;
  pointer __buf;
  
  if (this->outputPipe != -1) {
    __buf = (this->text)._M_dataplus._M_p;
    pcVar3 = __buf + (this->text)._M_string_length;
    for (; __buf <= pcVar3 && (long)pcVar3 - (long)__buf != 0; __buf = __buf + sVar1) {
      while (sVar1 = write(this->outputPipe,__buf,(long)pcVar3 - (long)__buf), sVar1 < 0) {
        piVar2 = __errno_location();
        if ((*piVar2 != 4) || (pcVar3 <= __buf)) goto LAB_001783d3;
      }
    }
LAB_001783d3:
    (this->text)._M_string_length = 0;
    *(this->text)._M_dataplus._M_p = '\0';
  }
  return;
}

Assistant:

void flush() {
    if (outputPipe != -1) {
      const char* pos = &*text.begin();
      const char* end = pos + text.size();

      while (pos < end) {
        miniposix::ssize_t n = miniposix::write(outputPipe, pos, end - pos);
        if (n < 0) {
          if (errno == EINTR) {
            continue;
          } else {
            break;  // Give up on error.
          }
        }
        pos += n;
      }

      text.clear();
    }
  }